

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covenant.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Options opts_;
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  int iVar5;
  STATUS SVar6;
  options_description_easy_init *poVar7;
  typed_value<unsigned_int,_char> *ptVar8;
  typed_value<int,_char> *ptVar9;
  typed_value<covenant::AbstractMethod,_char> *ptVar10;
  typed_value<covenant::GeneralizationMethod,_char> *ptVar11;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar12;
  Solver<covenant::Sym> *this;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar13;
  size_type sVar14;
  ostream *poVar15;
  void *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  ulong uVar17;
  size_type sVar18;
  reference pvVar19;
  undefined8 uVar20;
  Solver<covenant::Sym> *pSVar21;
  error *e_3;
  Exit *e_4;
  STATUS res;
  solver_t s;
  reg_solver_t *regsolver;
  error *e_2;
  Constraint cn;
  int ii;
  error *e_1;
  shared_ptr<covenant::TerminalFactory> tfac;
  StrParse input;
  CFGProblem problem;
  Options opts;
  uint i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  loggers;
  string line;
  ifstream fd;
  string infile;
  bool file_opened;
  string in;
  error *e;
  variables_map vm;
  options_description cmmdline_options;
  positional_options_description p;
  options_description log;
  options_description cegar_params;
  options_description hidden_params;
  options_description config;
  string header;
  uint num_solutions;
  bool is_dot_enabled;
  uint incr_witness;
  int freq_incr_witness;
  int shortest_witness;
  AbstractMethod abs;
  GeneralizationMethod gen;
  int max_cegar_iter;
  positional_options_description *in_stack_ffffffffffffe958;
  shared_ptr<covenant::TerminalFactory> *r;
  Constraint *in_stack_ffffffffffffe960;
  key_type *in_stack_ffffffffffffe968;
  undefined4 uVar23;
  Constraint *pCVar22;
  Constraint *in_stack_ffffffffffffe970;
  CFGProblem *in_stack_ffffffffffffe978;
  CFGProblem *in_stack_ffffffffffffe980;
  GeneralizationMethod *in_stack_ffffffffffffe988;
  typed_value<covenant::GeneralizationMethod,_char> *in_stack_ffffffffffffe990;
  ostream *in_stack_ffffffffffffe998;
  Solver<covenant::Sym> *in_stack_ffffffffffffe9a0;
  undefined4 in_stack_ffffffffffffe9a8;
  undefined4 in_stack_ffffffffffffe9ac;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffe9b0;
  reg_solver_t *in_stack_ffffffffffffe9c0;
  CFGProblem *in_stack_ffffffffffffe9c8;
  allocator *paVar24;
  basic_command_line_parser<char> *in_stack_ffffffffffffe9d0;
  Solver<covenant::Sym> *this_01;
  basic_command_line_parser<char> *in_stack_ffffffffffffe9d8;
  CFGProblem *in_stack_ffffffffffffe9e0;
  undefined8 in_stack_ffffffffffffe9e8;
  undefined8 in_stack_ffffffffffffe9f0;
  Constraint *in_stack_ffffffffffffe9f8;
  CFG *this_02;
  allocator local_1349;
  string local_1348 [32];
  undefined1 local_1328 [16];
  key_type *local_1318;
  Solver<covenant::Sym> *pSStack_1310;
  Solver<covenant::Sym> *in_stack_ffffffffffffeff8;
  allocator local_b59;
  string local_b58 [188];
  int local_a9c;
  undefined1 local_9c8 [16];
  key_type *local_9b8;
  Solver<covenant::Sym> *pSStack_9b0;
  string local_9a8 [32];
  uint local_988;
  allocator local_981;
  string local_980 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_960;
  allocator local_941;
  string local_940 [39];
  allocator local_919;
  string local_918 [39];
  allocator local_8f1;
  string local_8f0 [39];
  allocator local_8c9;
  string local_8c8 [32];
  string local_8a8 [32];
  istream local_888 [527];
  allocator local_679;
  string local_678 [32];
  string local_658 [39];
  allocator local_631;
  string local_630 [39];
  byte local_609;
  string local_608 [39];
  allocator local_5e1;
  string local_5e0 [36];
  int local_5bc;
  basic_parsed_options local_518 [40];
  variables_map local_4f0 [160];
  options_description local_450 [128];
  positional_options_description local_3d0 [56];
  undefined8 local_398;
  allocator local_389;
  string local_388 [32];
  options_description local_368 [132];
  undefined4 local_2e4;
  undefined4 local_2e0;
  undefined4 local_2dc;
  undefined8 local_2d8;
  allocator local_2c9;
  string local_2c8 [32];
  options_description local_2a8 [128];
  undefined8 local_228;
  allocator local_219;
  string local_218 [32];
  options_description local_1f8 [128];
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 local_16c;
  undefined8 local_168;
  allocator local_159;
  string local_158 [32];
  options_description local_138 [135];
  allocator local_b1;
  string local_b0 [39];
  undefined1 local_89 [57];
  string local_50 [32];
  uint local_30;
  byte local_29;
  uint local_28;
  int local_24;
  int local_20;
  AbstractMethod local_1c;
  GeneralizationMethod local_18;
  int local_14;
  int local_4;
  
  local_4 = 0;
  local_14 = -1;
  local_18 = GREEDY;
  local_1c = CYCLE_BREAKING;
  local_20 = 0;
  local_24 = -1;
  local_28 = 1;
  local_29 = 0;
  local_30 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_50,"Covenant: semi-decider for intersection of context-free languages\n",
             (allocator *)(local_89 + 0x38));
  std::allocator<char>::~allocator((allocator<char> *)(local_89 + 0x38));
  this_02 = (CFG *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_89 + 1),
             "Authors : G.Gange, J.A.Navas, P.Schachte, H.Sondergaard, and P.J.Stuckey\n",
             (allocator *)this_02);
  std::__cxx11::string::operator+=(local_50,(string *)(local_89 + 1));
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Usage   : covenant [Options] file",&local_b1);
  std::__cxx11::string::operator+=(local_50,local_b0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"General options ",&local_159);
  boost::program_options::options_description::options_description(local_138,local_158,0x50,0x28);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  local_168 = boost::program_options::options_description::add_options(local_138);
  poVar7 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)&local_168,"help,h","print help message");
  poVar7 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar7,"dot",
                      "print solutions and emptiness proofs in dot format as well as the result of abstractions and refinements"
                     );
  poVar7 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar7,"verbose,v","verbose mode");
  poVar7 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar7,"stats,s","Show some statistics and exit");
  boost::program_options::value<unsigned_int>((uint *)in_stack_ffffffffffffe970);
  local_16c = 1;
  ptVar8 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)in_stack_ffffffffffffe990,
                      in_stack_ffffffffffffe988);
  poVar7 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar7,"solutions",(value_semantic *)ptVar8,
                      "enumerate up to n solutions (default n=1)");
  boost::program_options::value<int>((int *)in_stack_ffffffffffffe970);
  local_170 = 0xffffffff;
  ptVar9 = boost::program_options::typed_value<int,_char>::default_value
                     ((typed_value<int,_char> *)in_stack_ffffffffffffe990,
                      (int *)in_stack_ffffffffffffe988);
  poVar7 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar7,"iter,i",(value_semantic *)ptVar9,
                      "maximum number of CEGAR iterations (default no limit)");
  boost::program_options::value<covenant::AbstractMethod>
            ((AbstractMethod *)in_stack_ffffffffffffe970);
  local_174 = 1;
  ptVar10 = boost::program_options::typed_value<covenant::AbstractMethod,_char>::default_value
                      ((typed_value<covenant::AbstractMethod,_char> *)in_stack_ffffffffffffe990,
                       in_stack_ffffffffffffe988);
  poVar7 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar7,"abs,a",(value_semantic *)ptVar10,
                      "choose abstraction method [sigma-star|cycle-breaking]");
  boost::program_options::value<covenant::GeneralizationMethod>
            ((GeneralizationMethod *)in_stack_ffffffffffffe970);
  local_178 = 0;
  ptVar11 = boost::program_options::typed_value<covenant::GeneralizationMethod,_char>::default_value
                      (in_stack_ffffffffffffe990,in_stack_ffffffffffffe988);
  boost::program_options::options_description_easy_init::operator()
            (poVar7,"gen,g",(value_semantic *)ptVar11,
             "choose generalization method [greedy|max-gen]");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"",&local_219);
  boost::program_options::options_description::options_description(local_1f8,local_218,0x50,0x28);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  local_228 = boost::program_options::options_description::add_options(local_1f8);
  ptVar12 = boost::program_options::value<std::__cxx11::string>();
  boost::program_options::options_description_easy_init::operator()
            ((options_description_easy_init *)&local_228,"input-file",(value_semantic *)ptVar12,
             "input file");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"(unsound) cegar options ",&local_2c9);
  boost::program_options::options_description::options_description(local_2a8,local_2c8,0x50,0x28);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  local_2d8 = boost::program_options::options_description::add_options(local_2a8);
  this = (Solver<covenant::Sym> *)
         boost::program_options::value<int>((int *)in_stack_ffffffffffffe970);
  local_2dc = 0;
  ptVar9 = boost::program_options::typed_value<int,_char>::default_value
                     ((typed_value<int,_char> *)in_stack_ffffffffffffe990,
                      (int *)in_stack_ffffffffffffe988);
  poVar7 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)&local_2d8,"l",(value_semantic *)ptVar9,
                      "shortest length of the witness (default 0)");
  boost::program_options::value<int>((int *)in_stack_ffffffffffffe970);
  local_2e0 = 0xffffffff;
  ptVar9 = boost::program_options::typed_value<int,_char>::default_value
                     ((typed_value<int,_char> *)in_stack_ffffffffffffe990,
                      (int *)in_stack_ffffffffffffe988);
  poVar7 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar7,"freq-incr-witness",(value_semantic *)ptVar9,
                      "how often increasing witnesses\' length");
  boost::program_options::value<unsigned_int>((uint *)in_stack_ffffffffffffe970);
  local_2e4 = 1;
  ptVar8 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)in_stack_ffffffffffffe990,
                      in_stack_ffffffffffffe988);
  boost::program_options::options_description_easy_init::operator()
            (poVar7,"delta-incr-witness",(value_semantic *)ptVar8,
             "how much witnesses\' length is incremented");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"Logging Options",&local_389);
  boost::program_options::options_description::options_description(local_368,local_388,0x50,0x28);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  local_398 = boost::program_options::options_description::add_options(local_368);
  ptVar13 = boost::program_options::
            value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  boost::program_options::options_description_easy_init::operator()
            ((options_description_easy_init *)&local_398,"log",(value_semantic *)ptVar13,
             "Enable specified log level");
  boost::program_options::positional_options_description::positional_options_description(local_3d0);
  boost::program_options::positional_options_description::add(local_3d0,"input-file",-1);
  boost::program_options::options_description::options_description(local_450,0x50,0x28);
  boost::program_options::options_description::add(local_450,local_138);
  boost::program_options::options_description::add(local_450,local_1f8);
  boost::program_options::options_description::add(local_450,local_2a8);
  boost::program_options::options_description::add(local_450,local_368);
  boost::program_options::variables_map::variables_map(local_4f0);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            (in_stack_ffffffffffffe9d0,(int)((ulong)in_stack_ffffffffffffe9c8 >> 0x20),
             (char **)in_stack_ffffffffffffe9c0);
  boost::program_options::basic_command_line_parser<char>::options
            ((basic_command_line_parser<char> *)in_stack_ffffffffffffe960,
             (options_description *)in_stack_ffffffffffffe958);
  boost::program_options::basic_command_line_parser<char>::positional
            ((basic_command_line_parser<char> *)in_stack_ffffffffffffe960,in_stack_ffffffffffffe958)
  ;
  boost::program_options::basic_command_line_parser<char>::run(in_stack_ffffffffffffe9d8);
  boost::program_options::store(local_518,local_4f0,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)0x1c74f6);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser
            ((basic_command_line_parser<char> *)0x1c7503);
  boost::program_options::notify(local_4f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e0,"help",&local_5e1);
  sVar14 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    *)in_stack_ffffffffffffe970,in_stack_ffffffffffffe968);
  std::__cxx11::string::~string(local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  if (sVar14 == 0) {
    std::__cxx11::string::string(local_608);
    local_609 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_630,"input-file",&local_631);
    sVar14 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                      *)in_stack_ffffffffffffe970,in_stack_ffffffffffffe968);
    std::__cxx11::string::~string(local_630);
    std::allocator<char>::~allocator((allocator<char> *)&local_631);
    if (sVar14 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_678,"input-file",&local_679);
      boost::program_options::variables_map::operator[]
                ((variables_map *)in_stack_ffffffffffffe960,(string *)in_stack_ffffffffffffe958);
      pbVar16 = boost::program_options::variable_value::as<std::__cxx11::string>
                          ((variable_value *)0x1c7b67);
      std::__cxx11::string::string(local_658,(string *)pbVar16);
      std::__cxx11::string::~string(local_678);
      std::allocator<char>::~allocator((allocator<char> *)&local_679);
      std::ifstream::ifstream(local_888);
      _Var3 = std::__cxx11::string::c_str();
      std::ifstream::open((char *)local_888,_Var3);
      bVar1 = std::ios::good();
      if ((bVar1 & 1) != 0) {
        local_609 = 1;
        while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
          std::__cxx11::string::string(local_8a8);
          std::getline<char,std::char_traits<char>,std::allocator<char>>(local_888,local_8a8);
          std::__cxx11::string::operator+=(local_608,local_8a8);
          std::__cxx11::string::operator+=(local_608,"\n");
          std::__cxx11::string::~string(local_8a8);
        }
        std::ifstream::close();
      }
      std::ifstream::~ifstream(local_888);
      std::__cxx11::string::~string(local_658);
    }
    if ((local_609 & 1) == 0) {
      poVar15 = std::operator<<((ostream *)&std::cout,"Input file not found ");
      std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      local_4 = 0;
      local_5bc = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8c8,"dot",&local_8c9);
      sVar14 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                        *)in_stack_ffffffffffffe970,in_stack_ffffffffffffe968);
      std::__cxx11::string::~string(local_8c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
      if (sVar14 != 0) {
        local_29 = 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8f0,"verbose",&local_8f1);
      sVar14 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                        *)in_stack_ffffffffffffe970,in_stack_ffffffffffffe968);
      std::__cxx11::string::~string(local_8f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
      if (sVar14 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_918,"verbose",&local_919);
        avy::AvyEnableLog((string *)in_stack_ffffffffffffe970);
        std::__cxx11::string::~string(local_918);
        std::allocator<char>::~allocator((allocator<char> *)&local_919);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_940,"log",&local_941);
      sVar14 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                        *)in_stack_ffffffffffffe970,in_stack_ffffffffffffe968);
      std::__cxx11::string::~string(local_940);
      std::allocator<char>::~allocator((allocator<char> *)&local_941);
      uVar23 = (undefined4)((ulong)in_stack_ffffffffffffe968 >> 0x20);
      if (sVar14 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_980,"log",&local_981);
        boost::program_options::variables_map::operator[]
                  ((variables_map *)in_stack_ffffffffffffe960,(string *)in_stack_ffffffffffffe958);
        boost::program_options::variable_value::
        as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((variable_value *)0x1c8197);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(in_stack_ffffffffffffe9b0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffe9ac,in_stack_ffffffffffffe9a8));
        std::__cxx11::string::~string(local_980);
        std::allocator<char>::~allocator((allocator<char> *)&local_981);
        local_988 = 0;
        while( true ) {
          uVar17 = (ulong)local_988;
          sVar18 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&local_960);
          uVar23 = (undefined4)((ulong)in_stack_ffffffffffffe968 >> 0x20);
          if (sVar18 <= uVar17) break;
          pvVar19 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](&local_960,(ulong)local_988);
          std::__cxx11::string::string(local_9a8,(string *)pvVar19);
          avy::AvyEnableLog((string *)in_stack_ffffffffffffe970);
          std::__cxx11::string::~string(local_9a8);
          local_988 = local_988 + 1;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffe970);
      }
      pCVar22 = (Constraint *)CONCAT44(uVar23,local_30);
      in_stack_ffffffffffffe960 =
           (Constraint *)CONCAT44((int)((ulong)in_stack_ffffffffffffe960 >> 0x20),local_28);
      r = (shared_ptr<covenant::TerminalFactory> *)
          CONCAT44((int)((ulong)in_stack_ffffffffffffe958 >> 0x20),local_24);
      covenant::Solver<covenant::Sym>::Options::Options
                ((Options *)local_9c8,local_14,local_18,local_1c,(bool)(local_29 & 1),local_20,
                 local_24,local_28,local_30);
      covenant::CFGProblem::CFGProblem((CFGProblem *)in_stack_ffffffffffffe970);
      covenant::StrParse::StrParse((StrParse *)in_stack_ffffffffffffe960,(string *)r);
      operator_new(0x18);
      covenant::TerminalFactory::TerminalFactory((TerminalFactory *)in_stack_ffffffffffffe990);
      boost::shared_ptr<covenant::TerminalFactory>::shared_ptr<covenant::TerminalFactory>
                ((shared_ptr<covenant::TerminalFactory> *)in_stack_ffffffffffffe980,
                 (TerminalFactory *)in_stack_ffffffffffffe978);
      boost::shared_ptr<covenant::TerminalFactory>::shared_ptr
                ((shared_ptr<covenant::TerminalFactory> *)in_stack_ffffffffffffe960,r);
      covenant::parse_problem<covenant::StrParse,boost::shared_ptr<covenant::TerminalFactory>>
                (in_stack_ffffffffffffe9e0,(StrParse *)in_stack_ffffffffffffe9d8,
                 (shared_ptr<covenant::TerminalFactory> *)in_stack_ffffffffffffe9d0);
      boost::shared_ptr<covenant::TerminalFactory>::~shared_ptr
                ((shared_ptr<covenant::TerminalFactory> *)0x1c8459);
      iVar4 = covenant::CFGProblem::size((CFGProblem *)0x1c8603);
      if (iVar4 == 0) {
        poVar15 = std::operator<<((ostream *)&std::cerr,"covenant: no CFGs found.");
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
        local_4 = 0;
        local_5bc = 1;
      }
      else {
        for (local_a9c = 0; iVar4 = local_a9c,
            iVar5 = covenant::CFGProblem::size((CFGProblem *)0x1c868c), iVar4 < iVar5;
            local_a9c = local_a9c + 1) {
          in_stack_ffffffffffffe9f8 =
               covenant::CFGProblem::operator[]
                         ((CFGProblem *)in_stack_ffffffffffffe960,(int)((ulong)r >> 0x20));
          covenant::CFGProblem::Constraint::Constraint(in_stack_ffffffffffffe970,pCVar22);
          bVar2 = std::vector<int,_std::allocator<int>_>::empty(&in_stack_ffffffffffffe970->vars);
          if (bVar2) {
            uVar20 = __cxa_allocate_exception(0x20);
            paVar24 = &local_b59;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_b58,"expected at least one CFG",paVar24);
            covenant::error::error((error *)in_stack_ffffffffffffe960,(string *)r);
            __cxa_throw(uVar20,&covenant::error::typeinfo,covenant::error::~error);
          }
          covenant::CFG::check_well_formed(this_02);
          covenant::CFGProblem::Constraint::~Constraint(in_stack_ffffffffffffe960);
        }
        pSVar21 = (Solver<covenant::Sym> *)operator_new(8);
        covenant::Product<covenant::Sym>::Product
                  ((Product<covenant::Sym> *)in_stack_ffffffffffffe960);
        this_01 = pSVar21;
        covenant::CFGProblem::CFGProblem(in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
        local_1318 = local_9b8;
        pSStack_1310 = pSStack_9b0;
        local_1328._0_8_ = local_9c8._0_8_;
        local_1328._8_8_ = local_9c8._8_8_;
        opts_.abs = (int)in_stack_ffffffffffffe9e8;
        opts_.is_dot_enabled = (bool)(char)((ulong)in_stack_ffffffffffffe9e8 >> 0x20);
        opts_._13_3_ = (int3)((ulong)in_stack_ffffffffffffe9e8 >> 0x28);
        opts_._0_8_ = in_stack_ffffffffffffe9e0;
        opts_.shortest_witness = (int)in_stack_ffffffffffffe9f0;
        opts_.freq_incr_witness = (int)((ulong)in_stack_ffffffffffffe9f0 >> 0x20);
        opts_._24_8_ = in_stack_ffffffffffffe9f8;
        covenant::Solver<covenant::Sym>::Solver
                  (this_01,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,opts_);
        covenant::CFGProblem::~CFGProblem((CFGProblem *)local_9c8._8_8_);
        covenant::Solver<covenant::Sym>::preprocess(this);
        paVar24 = &local_1349;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1348,"stats",paVar24);
        sVar14 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                 ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                          *)pSStack_9b0,local_9b8);
        std::__cxx11::string::~string(local_1348);
        std::allocator<char>::~allocator((allocator<char> *)&local_1349);
        if (sVar14 == 0) {
          SVar6 = covenant::Solver<covenant::Sym>::solve(in_stack_ffffffffffffeff8);
          if (SVar6 == SAT) {
            std::operator<<((ostream *)&std::cout,"======\nSAT\n======\n");
          }
          else if (SVar6 == UNSAT) {
            std::operator<<((ostream *)&std::cout,"======\nUNSAT\n======\n");
          }
          else {
            std::operator<<((ostream *)&std::cout,"======\nUNKNOWN\n======\n");
          }
          local_5bc = 0;
          in_stack_ffffffffffffe960 = (Constraint *)local_9c8._8_8_;
        }
        else {
          covenant::Solver<covenant::Sym>::stats
                    (in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998);
          if (pSVar21 != (Solver<covenant::Sym> *)0x0) {
            (**(code **)((long)&((pSVar21->problem).cns.
                                 super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->vars + 8))();
          }
          local_4 = 0;
          local_5bc = 1;
          in_stack_ffffffffffffe960 = (Constraint *)local_9c8._8_8_;
        }
        covenant::Solver<covenant::Sym>::~Solver(pSStack_9b0);
        if (local_5bc == 0) {
          if (pSVar21 != (Solver<covenant::Sym> *)0x0) {
            (**(code **)((long)&((pSVar21->problem).cns.
                                 super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->vars + 8))();
          }
          local_4 = 0;
          local_5bc = 1;
        }
      }
      boost::shared_ptr<covenant::TerminalFactory>::~shared_ptr
                ((shared_ptr<covenant::TerminalFactory> *)0x1c8e3e);
      covenant::StrParse::~StrParse((StrParse *)0x1c8e4b);
      covenant::CFGProblem::~CFGProblem((CFGProblem *)in_stack_ffffffffffffe960);
    }
    std::__cxx11::string::~string(local_608);
  }
  else {
    poVar15 = std::operator<<((ostream *)&std::cout,local_50);
    poVar15 = (ostream *)std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
    this_00 = (void *)boost::program_options::operator<<(poVar15,local_138);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
    local_5bc = 1;
  }
  boost::program_options::variables_map::~variables_map((variables_map *)in_stack_ffffffffffffe960);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffe960);
  boost::program_options::positional_options_description::~positional_options_description
            ((positional_options_description *)in_stack_ffffffffffffe960);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffe960);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffe960);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffe960);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffe960);
  std::__cxx11::string::~string(local_50);
  return local_4;
}

Assistant:

int main (int argc, char** argv)
{
  typedef Sym edge_sym_t;
  typedef Solver<edge_sym_t> solver_t;
  typedef RegSolver<edge_sym_t> reg_solver_t;

  // Main flags
  int max_cegar_iter=-1;
  GeneralizationMethod gen = GREEDY;
  AbstractMethod abs = CYCLE_BREAKING;
  // Heuristics flags
  // - regular solver will try to find a witness starting from this length
  int shortest_witness = 0;
  // - increase the witness length after n iterations -1 disable this option.
  int freq_incr_witness = -1;
  // - increment the witness length by n but only if freq_incr_witness >= 0
  unsigned incr_witness = 1;
  // Other flags
  bool is_dot_enabled=false;
  unsigned num_solutions = 1;

  string header("Covenant: semi-decider for intersection of context-free languages\n");
  header += string ("Authors : G.Gange, J.A.Navas, P.Schachte, H.Sondergaard, and P.J.Stuckey\n");
  header += string ("Usage   : covenant [Options] file");

  po::options_description config("General options ");
  config.add_options()
      ("help,h", "print help message")
      ("dot" , 
       "print solutions and emptiness proofs in dot format as well as the result of abstractions and refinements")
      ("verbose,v" , "verbose mode")
      ("stats,s", "Show some statistics and exit")
      ("solutions" , po::value<unsigned>(&num_solutions)->default_value(1), 
       "enumerate up to n solutions (default n=1)")
      ("iter,i",  po::value<int>(&max_cegar_iter)->default_value(-1), 
       "maximum number of CEGAR iterations (default no limit)")
      ("abs,a",  po::value<AbstractMethod>(&abs)->default_value(CYCLE_BREAKING), 
       "choose abstraction method [sigma-star|cycle-breaking]")
      ("gen,g",  po::value<GeneralizationMethod>(&gen)->default_value(GREEDY), 
       "choose generalization method [greedy|max-gen]")
      ;

  po::options_description hidden_params("");
  hidden_params.add_options()
      ("input-file",  po::value<string>(), "input file")
      ;
      
  po::options_description cegar_params("(unsound) cegar options ");
  cegar_params.add_options()
      ("l",  po::value<int>(&shortest_witness)->default_value(0), 
       "shortest length of the witness (default 0)")
      ("freq-incr-witness",  po::value<int>(&freq_incr_witness)->default_value(-1), 
       "how often increasing witnesses' length")
      ("delta-incr-witness",  po::value<unsigned>(&incr_witness)->default_value(1), 
       "how much witnesses' length is incremented")
      ;

  po::options_description log("Logging Options");
  log.add_options()
      ("log",  po::value<std::vector<string> >(), "Enable specified log level")
      ;

  po::positional_options_description p;
  p.add("input-file", -1);

  po::options_description cmmdline_options;
  cmmdline_options.add(config);
  cmmdline_options.add(hidden_params);
  cmmdline_options.add(cegar_params);
  cmmdline_options.add(log);
  
  po::variables_map vm;

  try {
    po::store(po::command_line_parser(argc, argv).
              options(cmmdline_options).
              positional(p).
              run(), vm);
    po::notify(vm);    
  }
  catch(error &e)
  {
    cerr << "covenant error:" << e << endl;
    return 0;
  }

  if (vm.count("help"))
  {
    cout << header << endl << config << endl; 
    return 0;
  }  

  std::string in;
  bool file_opened = false;
  if (vm.count ("input-file"))
  {
    std::string infile = vm ["input-file"].as<std::string> ();
    std::ifstream fd;
    fd.open (infile.c_str ());
    if (fd.good ())
    {
      file_opened = true;
      while (!fd.eof ())
      {
        std::string line;
        getline(fd, line);
        in += line;
        in += "\n";
      }
      fd.close ();
    }
  }

  if (!file_opened)
  {
    cout << "Input file not found " << endl;
    return 0;
  }

  if (vm.count("dot"))
  {
    is_dot_enabled = true;
  }

  if (vm.count("verbose"))
  {
    avy::AvyEnableLog ("verbose");
  }

  // enable loggers
  if (vm.count("log"))
  {
    vector<string> loggers = vm ["log"].as<vector<string> > ();
    for(unsigned int i=0; i<loggers.size (); i++)
    {
      avy::AvyEnableLog (loggers [i]);
    }
  }

  solver_t::Options opts(max_cegar_iter, 
                         gen, 
                         abs, 
                         is_dot_enabled, 
                         shortest_witness, 
                         freq_incr_witness, 
                         incr_witness,
                         num_solutions);

  CFGProblem problem;
  StrParse input(in); 
  boost::shared_ptr<TerminalFactory> tfac (new TerminalFactory ());
  try
  {
    parse_problem(problem, input, tfac);
  }
  catch(error &e)
  {
    cerr << "covenant error:" << e << endl;
    return 0;
  }

  if (problem.size() == 0)
  {
    cerr << "covenant: no CFGs found." << endl;  
    return 0;
  }

  try
  {
    for(int ii = 0; ii < problem.size(); ii++)
    {
      CFGProblem::Constraint cn(problem[ii]);
      if (cn.vars.empty())
      {
        throw error("expected at least one CFG");
      }
      cn.lang.check_well_formed();
    }
  }
  catch(error &e)
  {
    cerr << "covenant error:" << e << endl;
    return 0;
  }
    
  reg_solver_t *regsolver = new Product<edge_sym_t>();
  try
  {
    solver_t s(problem, regsolver, opts);

    s.preprocess ();

    if (vm.count("stats"))
    {
      s.stats (cout);
      delete regsolver;
      return 0;
    }

    STATUS res = s.solve();

    switch (res)
    {
      case SAT:
        cout << "======\nSAT\n======\n";
        break;
      case UNSAT:
        cout << "======\nUNSAT\n======\n";
        break;
      default:
        cout << "======\nUNKNOWN\n======\n";  
        break;
    }
      
  }
  catch(error &e)
  {
    cerr << "covenant error:" << e << endl;
  }
  catch(Exit &e)
  {
    cerr << e << endl;
  }

  delete regsolver;

  return 0;
}